

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v7::detail::bigint::align(bigint *this,bigint *other)

{
  int iVar1;
  ulong uVar2;
  uint *__s;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = this->exp_ - other->exp_;
  if (uVar4 != 0 && other->exp_ <= this->exp_) {
    iVar1 = (int)(this->bigits_).super_buffer<unsigned_int>.size_;
    if ((int)(uVar4 + iVar1) < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    uVar3 = (ulong)(uVar4 + iVar1);
    uVar2 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
    if (uVar2 < uVar3) {
      (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
      uVar2 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
    }
    if (uVar2 < uVar3) {
      uVar3 = uVar2;
    }
    (this->bigits_).super_buffer<unsigned_int>.size_ = uVar3;
    if (iVar1 < 1) {
      __s = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    }
    else {
      __s = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      uVar2 = 0;
      do {
        __s[(long)(int)(iVar1 + -1 + uVar4) + uVar2] = __s[(iVar1 - 1) + uVar2];
        uVar2 = uVar2 - 1;
      } while (~(ulong)(iVar1 - 1) != uVar2);
    }
    memset(__s,0,(ulong)uVar4 << 2);
    this->exp_ = this->exp_ - uVar4;
  }
  return;
}

Assistant:

void align(const bigint& other) {
    int exp_difference = exp_ - other.exp_;
    if (exp_difference <= 0) return;
    int num_bigits = static_cast<int>(bigits_.size());
    bigits_.resize(to_unsigned(num_bigits + exp_difference));
    for (int i = num_bigits - 1, j = i + exp_difference; i >= 0; --i, --j)
      bigits_[j] = bigits_[i];
    std::uninitialized_fill_n(bigits_.data(), exp_difference, 0);
    exp_ -= exp_difference;
  }